

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

HANDLE CreateFileW(LPCWSTR lpFileName,DWORD dwDesiredAccess,DWORD dwShareMode,
                  LPSECURITY_ATTRIBUTES lpSecurityAttributes,DWORD dwCreationDisposition,
                  DWORD dwFlagsAndAttributes,HANDLE hTemplateFile)

{
  undefined1 *puVar1;
  DWORD DVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  DWORD dwLastError;
  undefined1 *local_a0;
  HANDLE hRet;
  int length;
  int size;
  char *name;
  CPalThread *pCStack_80;
  PAL_ERROR palError;
  CPalThread *pThread;
  DWORD dwFlagsAndAttributes_local;
  DWORD dwCreationDisposition_local;
  LPSECURITY_ATTRIBUTES lpSecurityAttributes_local;
  DWORD dwShareMode_local;
  DWORD dwDesiredAccess_local;
  LPCWSTR lpFileName_local;
  PathCharString namePathString;
  
  namePathString.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  name._4_4_ = 0;
  pThread._0_4_ = dwFlagsAndAttributes;
  pThread._4_4_ = dwCreationDisposition;
  _dwFlagsAndAttributes_local = lpSecurityAttributes;
  lpSecurityAttributes_local._0_4_ = dwShareMode;
  lpSecurityAttributes_local._4_4_ = dwDesiredAccess;
  _dwShareMode_local = lpFileName;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpFileName_local);
  hRet._0_4_ = 0;
  local_a0 = &DAT_ffffffffffffffff;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  pCStack_80 = CorUnix::InternalGetCurrentThread();
  if (_dwShareMode_local != (char16_t *)0x0) {
    sVar3 = PAL_wcslen(_dwShareMode_local);
    hRet._0_4_ = ((int)sVar3 + 1) * MaxWCharToAcpLengthFactor;
  }
  _length = StackString<32UL,_char>::OpenStringBuffer
                      ((StackString<32UL,_char> *)&lpFileName_local,(long)(int)hRet);
  if (_length == (char *)0x0) {
    name._4_4_ = 8;
  }
  else {
    hRet._4_4_ = WideCharToMultiByte(0,0,_dwShareMode_local,-1,_length,(int)hRet,(LPCSTR)0x0,
                                     (LPBOOL)0x0);
    StackString<32UL,_char>::CloseBuffer
              ((StackString<32UL,_char> *)&lpFileName_local,(long)hRet._4_4_);
    if (hRet._4_4_ == 0) {
      DVar2 = GetLastError();
      if (DVar2 == 0x7a) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        name._4_4_ = 0xce;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","CreateFileW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                ,0x3fc);
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
        name._4_4_ = 0x54f;
      }
    }
    else {
      name._4_4_ = CorUnix::InternalCreateFile
                             (pCStack_80,_length,lpSecurityAttributes_local._4_4_,
                              (DWORD)lpSecurityAttributes_local,_dwFlagsAndAttributes_local,
                              pThread._4_4_,(DWORD)pThread,hTemplateFile,&local_a0);
    }
  }
  CorUnix::CPalThread::SetLastError(name._4_4_);
  puVar1 = local_a0;
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpFileName_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != namePathString.m_count) {
      __stack_chk_fail();
    }
    return puVar1;
  }
  abort();
}

Assistant:

HANDLE
PALAPI
CreateFileW(
        IN LPCWSTR lpFileName,
        IN DWORD dwDesiredAccess,
        IN DWORD dwShareMode,
        IN LPSECURITY_ATTRIBUTES lpSecurityAttributes,
        IN DWORD dwCreationDisposition,
        IN DWORD dwFlagsAndAttributes,
        IN HANDLE hTemplateFile)
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;
    PathCharString namePathString;
    char * name;
    int size;
    int length = 0;
    HANDLE  hRet = INVALID_HANDLE_VALUE;

    PERF_ENTRY(CreateFileW);
    ENTRY("CreateFileW(lpFileName=%p (%S), dwAccess=%#x, dwShareMode=%#x, "
          "lpSecurityAttr=%p, dwDisposition=%#x, dwFlags=%#x, hTemplateFile=%p )\n",
          lpFileName?lpFileName:W16_NULLSTRING,
          lpFileName?lpFileName:W16_NULLSTRING, dwDesiredAccess, dwShareMode,
          lpSecurityAttributes, dwCreationDisposition, dwFlagsAndAttributes,
          hTemplateFile);

    pThread = InternalGetCurrentThread();

    if (lpFileName != NULL)
    {
        length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    }
    
    name = namePathString.OpenStringBuffer(length);
    if (NULL == name)
    {
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    
    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, name, length,
                                NULL, NULL );
    namePathString.CloseBuffer(size);    

    if( size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            palError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            palError = ERROR_INTERNAL_ERROR;
        }
        goto done;
    }

    palError = InternalCreateFile(
        pThread,
        name,
        dwDesiredAccess,
        dwShareMode,
        lpSecurityAttributes,
        dwCreationDisposition,
        dwFlagsAndAttributes,
        hTemplateFile,
        &hRet
        );

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

done:
	pThread->SetLastError(palError);
    LOGEXIT( "CreateFileW returns HANDLE %p\n", hRet );
    PERF_EXIT(CreateFileW);
    return hRet;
}